

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

long ConnectionKillOne(SessionHandle *data)

{
  connectdata *pcVar1;
  bool bVar2;
  long lVar3;
  timeval newer;
  timeval now;
  long score;
  long connindex;
  long highscore;
  connectdata *conn;
  long i;
  SessionHandle *data_local;
  
  connindex = -1;
  score = -1;
  newer = curlx_tvnow();
  conn = (connectdata *)0x0;
  while( true ) {
    bVar2 = false;
    if ((data->state).connc != (conncache *)0x0) {
      bVar2 = (long)conn < ((data->state).connc)->num;
    }
    if (!bVar2) break;
    pcVar1 = ((data->state).connc)->connects[(long)conn];
    if (((pcVar1 != (connectdata *)0x0) && ((pcVar1->inuse & 1U) == 0)) &&
       (lVar3 = curlx_tvdiff(newer,pcVar1->now), connindex < lVar3)) {
      score = (long)conn;
      connindex = lVar3;
    }
    conn = (connectdata *)((long)&conn->data + 1);
  }
  if (-1 < score) {
    pcVar1 = ((data->state).connc)->connects[score];
    pcVar1->data = data;
    Curl_disconnect(pcVar1,false);
    ((data->state).connc)->connects[score] = (connectdata *)0x0;
  }
  return score;
}

Assistant:

static long
ConnectionKillOne(struct SessionHandle *data)
{
  long i;
  struct connectdata *conn;
  long highscore=-1;
  long connindex=-1;
  long score;
  struct timeval now;

  now = Curl_tvnow();

  for(i=0; data->state.connc && (i< data->state.connc->num); i++) {
    conn = data->state.connc->connects[i];

    if(!conn || conn->inuse)
      continue;

    /* Set higher score for the age passed since the connection was used */
    score = Curl_tvdiff(now, conn->now);

    if(score > highscore) {
      highscore = score;
      connindex = i;
    }
  }
  if(connindex >= 0) {
    /* Set the connection's owner correctly */
    conn = data->state.connc->connects[connindex];
    conn->data = data;

    /* the winner gets the honour of being disconnected */
    (void)Curl_disconnect(conn, /* dead_connection */ FALSE);

    /* clean the array entry */
    data->state.connc->connects[connindex] = NULL;
  }

  return connindex; /* return the available index or -1 */
}